

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O3

string * __thiscall
glcts::GeometryShaderMaxShaderStorageBlocksTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderMaxShaderStorageBlocksTest *this)

{
  ostream *poVar1;
  int iVar2;
  string *gs_code_specialized;
  string gs_code;
  char *gs_code_raw;
  stringstream code_sstream;
  long *local_1e0;
  long local_1d0 [2];
  char *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nint counter = 0;\n\n"
             ,0x87);
  if (0 < this->m_gl_max_geometry_shader_storage_blocks_ext_value) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(binding = ",0x11);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,") buffer ssb",0xc);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," \n{\n",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    int value;\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} S_SSB",7);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n\n",3);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_gl_max_geometry_shader_storage_blocks_ext_value);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nvoid main()\n{\n",0xf);
  if (0 < this->m_gl_max_geometry_shader_storage_blocks_ext_value) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"    counter += S_SSB",0x14);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".value++;\n",10);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_gl_max_geometry_shader_storage_blocks_ext_value);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n    gl_Position = vec4(float(counter), 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n",0x4c
            );
  std::__cxx11::stringbuf::str();
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&local_1c0);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderMaxShaderStorageBlocksTest::getGSCode()
{
	std::stringstream code_sstream;

	/* Form the GS */
	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout (points)                   in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"int counter = 0;\n"
					"\n";

	for (glw::GLint n_ssb = 0; n_ssb < (m_gl_max_geometry_shader_storage_blocks_ext_value); ++n_ssb)
	{
		code_sstream << "layout(binding = " << n_ssb << ") buffer ssb" << n_ssb << " \n{\n"
					 << "    int value;\n"
					 << "} S_SSB" << n_ssb << ";\n\n";
	}

	code_sstream << "\n"
					"void main()\n"
					"{\n";

	for (glw::GLint n_ssb = 0; n_ssb < (m_gl_max_geometry_shader_storage_blocks_ext_value); ++n_ssb)
	{
		code_sstream << "    counter += S_SSB" << n_ssb << ".value++;\n";
	}

	code_sstream << "\n"
					"    gl_Position = vec4(float(counter), 0.0, 0.0, 1.0);\n"
					"    EmitVertex();\n"
					"}\n";

	/* Form a specialized version of the GS source code */
	std::string gs_code				= code_sstream.str();
	const char* gs_code_raw			= gs_code.c_str();
	std::string gs_code_specialized = specializeShader(1 /* parts */, &gs_code_raw);

	return gs_code_specialized;
}